

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_copy_bytes(CBS *cbs,uint8_t *out,size_t len)

{
  uint8_t *__src;
  int iVar1;
  
  iVar1 = 0;
  if (len <= cbs->len) {
    __src = cbs->data;
    cbs->data = __src + len;
    cbs->len = cbs->len - len;
    iVar1 = 1;
    if (len != 0) {
      memcpy(out,__src,len);
    }
  }
  return iVar1;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}